

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 EngineRelease(jx9 *pEngine)

{
  jx9_vm *pjVar1;
  int iVar2;
  sxi32 sVar3;
  jx9_vm *pVm;
  
  iVar2 = pEngine->iVm;
  pVm = pEngine->pVms;
  while (0 < iVar2) {
    pjVar1 = pVm->pNext;
    jx9VmRelease(pVm);
    iVar2 = pEngine->iVm + -1;
    pEngine->iVm = iVar2;
    pVm = pjVar1;
  }
  pEngine->nMagic = 0x7635;
  sVar3 = SyMemBackendRelease(&pEngine->sAllocator);
  return sVar3;
}

Assistant:

static sxi32 EngineRelease(jx9 *pEngine)
{
	jx9_vm *pVm, *pNext;
	/* Release all active VM */
	pVm = pEngine->pVms;
	for(;;){
		if( pEngine->iVm < 1 ){
			break;
		}
		pNext = pVm->pNext;
		jx9VmRelease(pVm);
		pVm = pNext;
		pEngine->iVm--;
	}
	/* Set a dummy magic number */
	pEngine->nMagic = 0x7635;
	/* Release the private memory subsystem */
	SyMemBackendRelease(&pEngine->sAllocator); 
	return JX9_OK;
}